

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec4 ImGui::ColorConvertU32ToFloat4(ImU32 in)

{
  ImVec4 IVar1;
  
  IVar1.x = (float)(in & 0xff) * 0.003921569;
  IVar1.y = (float)(in >> 8 & 0xff) * 0.003921569;
  IVar1.z = (float)(in >> 0x10 & 0xff) * 0.003921569;
  IVar1.w = (float)(in >> 0x18) * 0.003921569;
  return IVar1;
}

Assistant:

ImVec4 ImGui::ColorConvertU32ToFloat4(ImU32 in)
{
    float s = 1.0f/255.0f;
    return ImVec4(
        ((in >> IM_COL32_R_SHIFT) & 0xFF) * s,
        ((in >> IM_COL32_G_SHIFT) & 0xFF) * s,
        ((in >> IM_COL32_B_SHIFT) & 0xFF) * s,
        ((in >> IM_COL32_A_SHIFT) & 0xFF) * s);
}